

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectActiveSubroutineUniformiv
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **uniform_names)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  GLuint i;
  long lVar7;
  ulong uVar8;
  GLint n_active_subroutine_uniforms;
  vector<int,_std::allocator<int>_> compatible_subroutines;
  inspectionDetails details [3];
  MessageBuilder message;
  int local_1fc;
  vector<int,_std::allocator<int>_> local_1f8;
  GLenum local_1d8 [6];
  long local_1c0;
  GLchar **local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1b8 = uniform_names;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  local_1fc = 0;
  local_1d8[0] = 0x8e4a;
  local_1d8[1] = this->m_n_active_subroutines;
  local_1d8[2] = 0x8a38;
  local_1d8[3] = this->m_n_active_subroutine_uniform_size;
  local_1d8[4] = 0x8a39;
  local_1d8[5] = 0;
  (**(code **)(lVar7 + 0x9d0))(program_id,0x8b31,0x8de6,&local_1fc);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xd7f);
  if (local_1fc < 1) {
    bVar6 = true;
  }
  else {
    bVar6 = true;
    uVar8 = 0;
    local_1c0 = lVar7;
    do {
      sVar4 = strlen(local_1b8[uVar8]);
      local_1d8[5] = (int)sVar4 + 1;
      lVar7 = 0;
      do {
        bVar1 = checkActiveSubroutineUniformiv
                          (this,program_id,(GLuint)uVar8,local_1d8[lVar7 * 2],
                           local_1d8[lVar7 * 2 + 1]);
        if (!bVar1) {
          bVar6 = false;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::resize(&local_1f8,(long)this->m_n_active_subroutines);
      lVar7 = local_1c0;
      (**(code **)(local_1c0 + 0x748))
                (program_id,0x8b31,uVar8 & 0xffffffff,0x8e4b,
                 local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar3,"getActiveSubroutineUniformiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0xd98);
      iVar2 = this->m_n_active_subroutines;
      if ((long)iVar2 < 1) {
        iVar5 = 0;
      }
      else {
        lVar7 = 0;
        iVar5 = 0;
        do {
          iVar5 = iVar5 + local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7];
          lVar7 = lVar7 + 1;
        } while (iVar2 != lVar7);
      }
      if (((iVar2 + -1) * iVar2) / 2 != iVar5) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "Error. Invalid result. Function: getActiveSubroutineUniformiv. idnex: ",0x46);
        std::ostream::operator<<(this_00,(GLuint)uVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". pname: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"GL_COMPATIBLE_SUBROUTINES",0x19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Results: ",0xb);
        if (1 < this->m_n_active_subroutines) {
          lVar7 = 1;
          do {
            std::ostream::operator<<
                      (local_1b0 + 8,
                       local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7]);
            lVar7 = lVar7 + 1;
          } while (lVar7 < this->m_n_active_subroutines);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        bVar6 = false;
      }
      if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)local_1fc);
  }
  return bVar6;
}

Assistant:

bool FunctionalTest3_4::inspectActiveSubroutineUniformiv(GLuint program_id, const GLchar** uniform_names) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutine_uniforms = 0;

	inspectionDetails details[] = {
		{ GL_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_UNIFORM_SIZE, m_n_active_subroutine_uniform_size },
		{ GL_UNIFORM_NAME_LENGTH, 0 },
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	/* Get amount of active subroutine uniforms */
	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		GLint name_length = (GLint)strlen(uniform_names[uniform]);

		details[2].expected_value = name_length + 1;

		/* Checks from "details" */
		for (GLuint i = 0; i < n_details; ++i)
		{
			if (false ==
				checkActiveSubroutineUniformiv(program_id, uniform, details[i].pname, details[i].expected_value))
			{
				result = false;
			}
		}

		/* Check compatible subroutines */
		std::vector<GLint> compatible_subroutines;
		compatible_subroutines.resize(m_n_active_subroutines);
		GLint index_sum = 0;

		gl.getActiveSubroutineUniformiv(program_id, GL_VERTEX_SHADER, uniform, GL_COMPATIBLE_SUBROUTINES,
										&compatible_subroutines[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getActiveSubroutineUniformiv");

		/* Expected indices are 0, 1, 2, ... N */
		for (GLint i = 0; i < m_n_active_subroutines; ++i)
		{
			index_sum += compatible_subroutines[i];
		}

		/* Sum of E1, ..., EN = (E1 + EN) * N / 2 */
		if (((m_n_active_subroutines - 1) * m_n_active_subroutines) / 2 != index_sum)
		{
			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Error. Invalid result. Function: getActiveSubroutineUniformiv. idnex: " << uniform
					<< ". pname: " << Utils::pnameToStr(GL_COMPATIBLE_SUBROUTINES) << ". Results: ";

			for (GLint i = 1; i < m_n_active_subroutines; ++i)
			{
				message << compatible_subroutines[i];
			}

			message << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	return result;
}